

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

bool __thiscall ON_PolylineCurve::ChangeClosedCurveSeam(ON_PolylineCurve *this,double t)

{
  ON_3dPoint *pOVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  int iVar8;
  char cVar9;
  size_t new_capacity;
  long lVar10;
  double dVar11;
  double k;
  ON_Interval old_dom;
  ON_SimpleArray<double> new_t;
  ON_SimpleArray<ON_3dPoint> new_pt;
  ON_3dPoint new_start;
  ON_Interval span_domain;
  double local_f0;
  double local_e8;
  size_t local_e0;
  double local_d8;
  ON_Interval local_d0;
  ON_SimpleArray<double> local_c0;
  int local_a4;
  ON_SimpleArray<ON_3dPoint> local_a0;
  long local_88;
  ON_Polyline *local_80;
  ON_3dPoint local_78;
  ON_Interval local_58;
  ON_SimpleArray<ON_3dPoint> local_48;
  
  local_d8 = t;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])(this);
  cVar2 = (char)iVar5;
  if (cVar2 == '\0') {
    return false;
  }
  local_f0 = local_d8;
  bVar3 = ON_Interval::Includes(&local_d0,local_d8,false);
  if (!bVar3) {
    dVar11 = ON_Interval::NormalizedParameterAt(&local_d0,local_d8);
    dVar11 = fmod(dVar11,1.0);
    local_f0 = ON_Interval::ParameterAt
                         (&local_d0,
                          (double)(~-(ulong)(dVar11 < 0.0) & (ulong)dVar11 |
                                  (ulong)(dVar11 + 1.0) & -(ulong)(dVar11 < 0.0)));
  }
  bVar4 = ON_Interval::Includes(&local_d0,local_f0,true);
  bVar3 = true;
  cVar9 = '\x01';
  if (bVar4) {
    local_80 = &this->m_pline;
    iVar5 = ON_Polyline::PointCount(local_80);
    bVar4 = false;
    uVar6 = ON_NurbsSpanIndex(2,iVar5,(this->m_t).m_a,local_f0,0,0);
    pdVar7 = (this->m_t).m_a;
    cVar9 = cVar2;
    if (pdVar7[(int)uVar6] <= local_f0) {
      if (pdVar7[(long)(int)uVar6 + 1] <= local_f0) {
        bVar4 = false;
      }
      else {
        ON_Interval::ON_Interval(&local_58,pdVar7[(int)uVar6],pdVar7[(long)(int)uVar6 + 1]);
        dVar11 = ON_Interval::NormalizedParameterAt(&local_58,local_f0);
        if (dVar11 <= 1.7763568394002505e-15) {
          pdVar7 = ON_Interval::operator[](&local_58,0);
          local_f0 = *pdVar7;
        }
        else if (0.9999999999999982 <= dVar11) {
          pdVar7 = ON_Interval::operator[](&local_58,1);
          local_f0 = *pdVar7;
          uVar6 = ON_NurbsSpanIndex(2,iVar5,(this->m_t).m_a,local_f0,0,0);
        }
        local_e8 = local_f0;
        dVar11 = ON_Interval::operator[](&local_d0,0);
        bVar4 = true;
        if ((local_e8 != dVar11) || (cVar9 = '\x01', NAN(local_e8) || NAN(dVar11))) {
          local_e8 = local_f0;
          dVar11 = ON_Interval::operator[](&local_d0,1);
          if ((local_e8 != dVar11) || (cVar9 = '\x01', NAN(local_e8) || NAN(dVar11))) {
            local_e8 = (double)(long)(int)uVar6;
            local_88 = -(ulong)((this->m_t).m_a[(long)local_e8] != local_f0);
            iVar8 = iVar5 - (int)local_88;
            new_capacity = (size_t)iVar8;
            local_a0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
            local_a0.m_a = (ON_3dPoint *)0x0;
            local_a0.m_count = 0;
            local_a0.m_capacity = 0;
            if (iVar8 != 0) {
              local_e0 = new_capacity;
              local_a4 = iVar8;
              ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_a0,new_capacity);
              new_capacity = local_e0;
              iVar8 = local_a4;
            }
            local_c0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
            local_c0.m_a = (double *)0x0;
            local_c0.m_count = 0;
            local_c0.m_capacity = 0;
            if (iVar8 != 0) {
              ON_SimpleArray<double>::SetCapacity(&local_c0,new_capacity);
            }
            pdVar7 = (this->m_t).m_a + (long)local_e8;
            local_e0 = (long)local_e8 * 3;
            if ((local_f0 != *pdVar7) || (NAN(local_f0) || NAN(*pdVar7))) {
              ON_Curve::PointAt(&local_78,&this->super_ON_Curve,local_f0);
            }
            else {
              pOVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
              local_78.z = pOVar1[(long)local_e8].z;
              pOVar1 = pOVar1 + (long)local_e8;
              local_78.x = pOVar1->x;
              local_78.y = pOVar1->y;
            }
            ON_SimpleArray<ON_3dPoint>::Append(&local_a0,&local_78);
            ON_SimpleArray<double>::Append(&local_c0,&local_f0);
            ON_SimpleArray<ON_3dPoint>::Append
                      (&local_a0,iVar5 + ~uVar6,
                       (ON_3dPoint *)
                       (&(this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a
                         [1].x + local_e0));
            ON_SimpleArray<double>::Append
                      (&local_c0,iVar5 + ~uVar6,(this->m_t).m_a + (long)local_e8 + 1);
            iVar5 = local_c0.m_count;
            lVar10 = (long)local_c0.m_count;
            iVar8 = uVar6 + ((uint)local_88 & 1) + -1;
            ON_SimpleArray<ON_3dPoint>::Append
                      (&local_a0,iVar8,
                       (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a +
                       1);
            ON_SimpleArray<double>::Append(&local_c0,iVar8,(this->m_t).m_a + 1);
            ON_SimpleArray<ON_3dPoint>::Append(&local_a0,&local_78);
            ON_SimpleArray<double>::Append(&local_c0,&local_f0);
            dVar11 = ON_Interval::Length(&local_d0);
            if (iVar5 < local_c0.m_count) {
              do {
                local_c0.m_a[lVar10] = local_c0.m_a[lVar10] + dVar11;
                lVar10 = lVar10 + 1;
              } while (local_c0.m_count != lVar10);
            }
            ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_48,&local_a0);
            ON_Polyline::operator=(local_80,(ON_3dPointArray *)&local_48);
            ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_48);
            ON_SimpleArray<double>::operator=(&this->m_t,&local_c0);
            ON_SimpleArray<double>::~ON_SimpleArray(&local_c0);
            ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_a0);
            cVar9 = cVar2;
          }
        }
      }
    }
    if (!bVar4) {
      bVar3 = false;
      goto LAB_0059a675;
    }
  }
  if (cVar9 != '\0') {
    dVar11 = ON_Interval::operator[](&local_d0,0);
    if ((dVar11 != local_d8) || (NAN(dVar11) || NAN(local_d8))) {
      dVar11 = ON_Interval::Length(&local_d0);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (local_d8,dVar11 + local_d8,this);
    }
  }
LAB_0059a675:
  if (!bVar3) {
    cVar9 = '\0';
  }
  return (bool)cVar9;
}

Assistant:

bool ON_PolylineCurve::ChangeClosedCurveSeam( double t )
{
  const ON_Interval old_dom = Domain();
  bool rc = IsClosed();
  if ( rc )
  {
    double k = t;

    if ( !old_dom.Includes(t) )
    {
      // If you know why this is here, please add
      // a bug reference so we can retest when this code
      // is cleaned up.  It needs to be cleaned up.
      double s = old_dom.NormalizedParameterAt(t);
      s = fmod(s,1.0);
      if ( s < 0.0 )
        s += 1.0;
      k = old_dom.ParameterAt(s);
    }



    if ( old_dom.Includes(k,true) )
    {
      int old_count = PointCount();
      int i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      if ( k < m_t[i] )
        return false;
      if ( k >= m_t[i+1] )
        return false;

      // 20 Feb 2014 Dale L & Lowell - This was making a new point in the polyline
      // when the seam was changed to a t within eps of an existing point.
      // This change snaps the t to existing points if it is within normalized_span_tol
      // of one that already exists. ON_EPSILON didn't quite work but 8 * ON_EPSILON does
      // comparing t = 4149.8519999999990 to m_t[1] = 4149.8519999999980 in RH-24591
      ON_Interval span_domain(m_t[i],m_t[i+1]);
      double s = span_domain.NormalizedParameterAt(k);
      double normalized_span_tol = 8.0*ON_EPSILON;
      if ( s <= normalized_span_tol )
      {
        k = span_domain[0];
      }
      else if ( s >= 1.0 - normalized_span_tol )
      {
        k = span_domain[1];
        i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      }

      if ( k == old_dom[0] || k == old_dom[1] )
      {
        // k already at start end of this curve
        rc = true;
      }
      else
      {
        int new_count = (k==m_t[i]) ? old_count : old_count+1;
        ON_SimpleArray<ON_3dPoint> new_pt(new_count);
        ON_SimpleArray<double> new_t(new_count);
        ON_3dPoint new_start = (k==m_t[i]) ? m_pline[i] : PointAt(k);
        new_pt.Append( new_start );
        new_t.Append(k);
        int n = old_count-i-1;
        new_pt.Append( n, m_pline.Array() + i+1 );
        new_t.Append( n, m_t.Array() + i+1 );
      
        int j = new_t.Count();

        n = new_count-old_count+i-1;
        new_pt.Append( n, m_pline.Array() + 1 );
        new_t.Append(  n, m_t.Array() + 1 );

        new_pt.Append( new_start );
        new_t.Append(k);

        double d = old_dom.Length();
        while ( j  < new_t.Count() )
        {
          new_t[j] += d;
          j++;
        }

        m_pline = new_pt;
        m_t = new_t;
      }
    }
    else
    {
      // k already at start end of this curve
      rc = true;
    }

    if ( rc  && t != old_dom[0] )
      SetDomain( t, t + old_dom.Length() );
  }
  return rc;
}